

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool flatbuffers::StringToFloatImpl<float>(float *val,char *str)

{
  uint uVar1;
  bool bVar2;
  float fVar3;
  char *pcStack_20;
  bool done;
  char *end;
  char *str_local;
  float *val_local;
  
  end = str;
  str_local = (char *)val;
  if (str != (char *)0x0 && val != (float *)0x0) {
    pcStack_20 = str;
    strtoval_impl(val,str,&stack0xffffffffffffffe0);
    bVar2 = false;
    if (pcStack_20 != end) {
      bVar2 = *pcStack_20 == '\0';
    }
    if (bVar2) {
      uVar1 = std::isnan((double)(ulong)*(uint *)str_local);
      if ((uVar1 & 1) != 0) {
        fVar3 = std::numeric_limits<float>::quiet_NaN();
        *(float *)str_local = fVar3;
      }
    }
    else {
      str_local[0] = '\0';
      str_local[1] = '\0';
      str_local[2] = '\0';
      str_local[3] = '\0';
    }
    return bVar2;
  }
  __assert_fail("str && val",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                ,0x138,"bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = float]");
}

Assistant:

inline bool StringToFloatImpl(T *val, const char *const str) {
  // Type T must be either float or double.
  FLATBUFFERS_ASSERT(str && val);
  auto end = str;
  strtoval_impl(val, str, const_cast<char **>(&end));
  auto done = (end != str) && (*end == '\0');
  if (!done) *val = 0;  // erase partial result
  if (done && std::isnan(*val)) { *val = std::numeric_limits<T>::quiet_NaN(); }
  return done;
}